

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stream.cc
# Opt level: O0

void __thiscall avro::MemoryOutputStream::~MemoryOutputStream(MemoryOutputStream *this)

{
  bool bVar1;
  iterator this_00;
  reference ppuVar2;
  OutputStream *in_RDI;
  const_iterator it;
  vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *in_stack_ffffffffffffffc8;
  __normal_iterator<unsigned_char_*const_*,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_>
  *in_stack_ffffffffffffffd0;
  __normal_iterator<unsigned_char_*const_*,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_>
  local_10 [2];
  
  in_RDI->_vptr_OutputStream = (_func_int **)&PTR__MemoryOutputStream_0030d848;
  std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::begin(in_stack_ffffffffffffffc8);
  __gnu_cxx::
  __normal_iterator<unsigned_char*const*,std::vector<unsigned_char*,std::allocator<unsigned_char*>>>
  ::__normal_iterator<unsigned_char**>
            (in_stack_ffffffffffffffd0,
             (__normal_iterator<unsigned_char_**,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_>
              *)in_stack_ffffffffffffffc8);
  while( true ) {
    this_00 = std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::end
                        (in_stack_ffffffffffffffc8);
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffffd0,
                       (__normal_iterator<unsigned_char_**,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_>
                        *)in_stack_ffffffffffffffc8);
    if (!bVar1) break;
    ppuVar2 = __gnu_cxx::
              __normal_iterator<unsigned_char_*const_*,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_>
              ::operator*(local_10);
    in_stack_ffffffffffffffd0 =
         (__normal_iterator<unsigned_char_*const_*,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_>
          *)*ppuVar2;
    if (in_stack_ffffffffffffffd0 !=
        (__normal_iterator<unsigned_char_*const_*,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_>
         *)0x0) {
      operator_delete__(in_stack_ffffffffffffffd0);
    }
    __gnu_cxx::
    __normal_iterator<unsigned_char_*const_*,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_>
    ::operator++(local_10);
  }
  std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::~vector
            ((vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)this_00._M_current);
  OutputStream::~OutputStream(in_RDI);
  return;
}

Assistant:

~MemoryOutputStream() {
        for (std::vector<uint8_t*>::const_iterator it = data_.begin();
            it != data_.end(); ++it) {
            delete[] *it;
        }
    }